

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eset.c
# Opt level: O2

void duckdb_je_eset_remove(eset_t *eset,edata_t *edata)

{
  atomic_zu_t *paVar1;
  ulong uVar2;
  void *pvVar3;
  uint64_t uVar4;
  long lVar5;
  _Bool _Var6;
  size_t sVar7;
  edata_t *peVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  ulong size;
  eset_bin_t *ph;
  edata_cmp_summary_t a;
  
  uVar2 = (edata->field_2).e_size_esn;
  size = uVar2 & 0xfffffffffffff000;
  sVar7 = duckdb_je_sz_psz_quantize_floor(size);
  if (sVar7 < 0x7000000000000001) {
    uVar11 = sVar7 - 1;
    if (uVar11 == 0) {
      uVar10 = 0x40;
    }
    else {
      lVar5 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
        }
      }
      uVar10 = (uint)lVar5 ^ 0x3f;
    }
    iVar12 = 0x32 - uVar10;
    if (0x32 < uVar10) {
      iVar12 = 0;
    }
    bVar9 = 0xc;
    if (0x4000 < sVar7) {
      bVar9 = (char)iVar12 + 0xb;
    }
    uVar11 = (ulong)(((uint)(uVar11 >> (bVar9 & 0x3f)) & 3) + iVar12 * 4);
  }
  else {
    uVar11 = 199;
  }
  eset->bin_stats[uVar11].nextents.repr = eset->bin_stats[uVar11].nextents.repr - 1;
  paVar1 = &eset->bin_stats[uVar11].nbytes;
  paVar1->repr = paVar1->repr - size;
  pvVar3 = edata->e_addr;
  uVar4 = edata->e_sn;
  ph = eset->bins + uVar11;
  duckdb_je_edata_heap_remove(&ph->heap,edata);
  _Var6 = duckdb_je_edata_heap_empty(&ph->heap);
  if (_Var6) {
    bVar9 = (byte)uVar11 & 0x3f;
    eset->bitmap[uVar11 >> 6] =
         eset->bitmap[uVar11 >> 6] & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
  }
  else {
    a.addr = (uintptr_t)pvVar3;
    a.sn = uVar4;
    iVar12 = edata_cmp_summary_comp(a,eset->bins[uVar11].heap_min);
    if (iVar12 == 0) {
      peVar8 = duckdb_je_edata_heap_first(&ph->heap);
      pvVar3 = peVar8->e_addr;
      eset->bins[uVar11].heap_min.sn = peVar8->e_sn;
      eset->bins[uVar11].heap_min.addr = (uintptr_t)pvVar3;
    }
  }
  peVar8 = (eset->lru).head.qlh_first;
  if (peVar8 == edata) {
    peVar8 = (peVar8->field_6).ql_link_inactive.qre_next;
    (eset->lru).head.qlh_first = peVar8;
  }
  if (peVar8 == edata) {
    (eset->lru).head.qlh_first = (edata_t *)0x0;
  }
  else {
    (((edata->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next =
         (((edata->field_6).ql_link_inactive.qre_next)->field_6).ql_link_inactive.qre_prev;
    peVar8 = (edata->field_6).ql_link_inactive.qre_prev;
    (((edata->field_6).ql_link_inactive.qre_next)->field_6).ql_link_inactive.qre_prev = peVar8;
    (edata->field_6).ql_link_inactive.qre_prev = (peVar8->field_6).ql_link_inactive.qre_next;
    peVar8 = (edata->field_6).ql_link_inactive.qre_next;
    (((peVar8->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = peVar8;
    (((edata->field_6).ql_link_inactive.qre_prev)->field_6).ql_link_inactive.qre_next = edata;
  }
  (eset->npages).repr = (eset->npages).repr - (uVar2 >> 0xc);
  return;
}

Assistant:

void
eset_remove(eset_t *eset, edata_t *edata) {
	assert(edata_state_get(edata) == eset->state ||
	    edata_state_in_transition(edata_state_get(edata)));

	size_t size = edata_size_get(edata);
	size_t psz = sz_psz_quantize_floor(size);
	pszind_t pind = sz_psz2ind(psz);
	if (config_stats) {
		eset_stats_sub(eset, pind, size);
	}

	edata_cmp_summary_t edata_cmp_summary = edata_cmp_summary_get(edata);
	edata_heap_remove(&eset->bins[pind].heap, edata);
	if (edata_heap_empty(&eset->bins[pind].heap)) {
		fb_unset(eset->bitmap, ESET_NPSIZES, (size_t)pind);
	} else {
		/*
		 * This is a little weird; we compare if the summaries are
		 * equal, rather than if the edata we removed was the heap
		 * minimum.  The reason why is that getting the heap minimum
		 * can cause a pairing heap merge operation.  We can avoid this
		 * if we only update the min if it's changed, in which case the
		 * summaries of the removed element and the min element should
		 * compare equal.
		 */
		if (edata_cmp_summary_comp(edata_cmp_summary,
		    eset->bins[pind].heap_min) == 0) {
			eset->bins[pind].heap_min = edata_cmp_summary_get(
			    edata_heap_first(&eset->bins[pind].heap));
		}
	}
	edata_list_inactive_remove(&eset->lru, edata);
	size_t npages = size >> LG_PAGE;
	/*
	 * As in eset_insert, we hold eset->mtx and so don't need atomic
	 * operations for updating eset->npages.
	 */
	size_t cur_extents_npages =
	    atomic_load_zu(&eset->npages, ATOMIC_RELAXED);
	assert(cur_extents_npages >= npages);
	atomic_store_zu(&eset->npages,
	    cur_extents_npages - (size >> LG_PAGE), ATOMIC_RELAXED);
}